

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove8<(moira::Instr)71,(moira::Mode)4,(moira::Size)4>(Moira *this,u16 opcode)

{
  int *piVar1;
  ushort uVar2;
  PrefetchQueue PVar3;
  u32 uVar4;
  undefined8 in_RAX;
  uint addr;
  AEStackFrame frame;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar4 = computeEA<(moira::Mode)4,(moira::Size)4,0ul>(this,opcode & 7);
  uVar4 = readM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,uVar4,&local_21);
  piVar1 = (int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  *piVar1 = *piVar1 + -4;
  if (local_21 == false) {
    (this->reg).sr.n = (bool)((byte)(uVar4 >> 0xf) & 1);
    (this->reg).sr.z = (short)uVar4 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    PVar3 = this->queue;
    readExt(this);
    uVar2 = (this->queue).irc;
    addr = (int)PVar3 << 0x10 | (uint)uVar2;
    if ((uVar2 & 1) == 0) {
      (this->reg).sr.n = SUB41(uVar4 >> 0x1f,0);
      (this->reg).sr.z = uVar4 == 0;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
      writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr,uVar4 >> 0x10);
      writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr + 2,uVar4 & 0xffff);
      readExt(this);
    }
    else {
      frame = makeFrame<40ul>(this,addr);
      execAddressError(this,frame,0);
    }
    if ((uVar2 & 1) == 0) {
      uVar4 = (this->reg).pc;
      (this->reg).pc0 = uVar4;
      (this->queue).ird = (this->queue).irc;
      uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
      (this->queue).irc = (u16)uVar4;
    }
  }
  return;
}

Assistant:

void
Moira::execMove8(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    /* Source: http://pasti.fxatari.com/68kdocs/68kPrefetch.html
     *
     * "When the destination addressing mode is long absolute and the source
     *  operand is any memory addr.mode, step 4 is interleaved in the middle of
     *  step 3. Step 3 only performs a single prefetch in this case. The other
     *  prefetch cycle that is normally performed at that step is deferred
     *  after the write cycles. So, two prefetch cycles are performed after the
     *  write ones. It is a class 2 instruction. Note: The behavior is the same
     *  disregarding transfer size (byte, word or long). But if the source
     *  operand is a data or address register, or immediate, then the behavior
     *  is the same as other MOVE variants (class 1 instruction)."
     */
    if (isMemMode(M)) {
        
        if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
        
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        u32 ea2 = queue.irc << 16;
        readExt();
        ea2 |= queue.irc;

        if (misaligned<S>(ea2)) {
            execAddressError(makeFrame<AE_WRITE|AE_DATA>(ea2));
            return;
        }

        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        writeM <MODE_AL,S> (ea2, data);
        readExt();
        
    } else {

        if (!readOp <M,S> (src, ea, data)) return;

        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;

        if (!writeOp <MODE_AL,S> (dst, data)) return;
    }

    prefetch<POLLIPL>();
}